

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_txn * wal_earliest_txn(filemgr *file,fdb_txn *cur_txn)

{
  fdb_txn *pfVar1;
  ulong uVar2;
  list_elem *plVar3;
  ulong uVar4;
  ulong uVar5;
  fdb_txn *pfVar6;
  fdb_txn *pfVar7;
  
  pthread_spin_lock(&file->wal->lock);
  plVar3 = (file->wal->txn_list).head;
  if (plVar3 == (list_elem *)0x0) {
    pfVar7 = (fdb_txn *)0x0;
  }
  else {
    uVar4 = 0;
    pfVar6 = (fdb_txn *)0x0;
    do {
      pfVar1 = (fdb_txn *)plVar3[1].prev;
      uVar5 = uVar4;
      pfVar7 = pfVar6;
      if ((((pfVar1 != cur_txn) && (pfVar1->items->head != (list_elem *)0x0)) &&
          (uVar2 = pfVar1->prev_revnum, uVar5 = uVar2, pfVar7 = pfVar1, uVar4 != 0)) &&
         (uVar5 = uVar4, pfVar7 = pfVar6, uVar2 < uVar4)) {
        uVar5 = uVar2;
        pfVar7 = pfVar1;
      }
      plVar3 = plVar3->next;
      uVar4 = uVar5;
      pfVar6 = pfVar7;
    } while (plVar3 != (list_elem *)0x0);
  }
  pthread_spin_unlock(&file->wal->lock);
  return pfVar7;
}

Assistant:

fdb_txn * wal_earliest_txn(struct filemgr *file, fdb_txn *cur_txn)
{
    struct list_elem *le;
    struct wal_txn_wrapper *txn_wrapper;
    fdb_txn *txn;
    fdb_txn *ret = NULL;
    uint64_t min_revnum = 0;

    spin_lock(&file->wal->lock);

    le = list_begin(&file->wal->txn_list);
    while(le) {
        txn_wrapper = _get_entry(le, struct wal_txn_wrapper, le);
        txn = txn_wrapper->txn;

        if (txn != cur_txn && list_begin(txn->items)) {
            if (min_revnum == 0 || txn->prev_revnum < min_revnum) {
                min_revnum = txn->prev_revnum;
                ret = txn;
            }
        }
        le = list_next(le);
    }
    spin_unlock(&file->wal->lock);

    return ret;
}